

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O1

void __thiscall
crnlib::dxt_hc::determine_color_endpoint_clusters_task(dxt_hc *this,uint64 data,void *pData_ptr)

{
  vec<6U,_float> *p;
  tile_details *ptVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  long lVar5;
  uint32 uVar6;
  uint uVar7;
  float *pfVar8;
  uint16 uVar9;
  float *pfVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  bool bVar21;
  float dist2;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  
  uVar18 = CONCAT44(0,this->m_pTask_pool->m_num_threads + 1);
  uVar20 = (ulong)(this->m_tiles).m_size;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar18;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar20 * data;
  uVar18 = ((data + 1) * uVar20) / uVar18;
  if (SUB164(auVar3 / auVar2,0) < (uint)uVar18) {
    uVar20 = SUB168(auVar3 / auVar2,0) & 0xffffffff;
    do {
      ptVar1 = (this->m_tiles).m_p;
      if (ptVar1[uVar20].pixels.m_size != 0) {
        p = &ptVar1[uVar20].color_endpoint;
        if (*(int *)((long)pData_ptr + 0x80) == 0) {
LAB_0017b6e6:
          uVar13 = *(uint *)((long)pData_ptr + 0x70);
        }
        else {
          uVar6 = fast_hash(p,0x18);
          uVar7 = uVar6 * -0x61c88647 >> (*(byte *)((long)pData_ptr + 0x78) & 0x1f);
          lVar11 = *(long *)((long)pData_ptr + 0x68);
          lVar15 = (ulong)uVar7 * 0x20;
          bVar4 = true;
          uVar13 = uVar7;
          if (*(char *)(lVar11 + 0x1c + lVar15) != '\0') {
            fVar22 = *(float *)(lVar11 + lVar15);
            fVar23 = p->m_s[0];
            if ((fVar22 == fVar23) && (!NAN(fVar22) && !NAN(fVar23))) {
              uVar16 = 0xffffffffffffffff;
              lVar19 = 0;
              while (uVar16 != 4) {
                fVar22 = *(float *)(lVar11 + lVar15 + 8 + uVar16 * 4);
                uVar16 = uVar16 + 1;
                lVar5 = lVar19 + 1;
                if ((fVar22 != p->m_s[lVar5]) ||
                   (lVar19 = lVar19 + 1, NAN(fVar22) || NAN(p->m_s[lVar5]))) goto LAB_0017b64b;
              }
              uVar16 = 5;
LAB_0017b64b:
              if (4 < uVar16) {
                bVar4 = false;
                goto LAB_0017b6de;
              }
            }
            uVar17 = *(int *)((long)pData_ptr + 0x70) - 1;
            uVar16 = (ulong)(uVar7 - 1);
            if (uVar7 == 0) {
              uVar16 = (ulong)uVar17;
            }
            uVar13 = (uint)uVar16;
            if (uVar13 != uVar7) {
              pfVar10 = (float *)(lVar11 + (ulong)uVar17 * 0x20);
              pfVar8 = (float *)(lVar11 + lVar15) + -8;
              if (uVar7 == 0) {
                pfVar8 = pfVar10;
              }
              do {
                uVar13 = (uint)uVar16;
                if (*(char *)(pfVar8 + 7) == '\0') break;
                if ((*pfVar8 == fVar23) && (!NAN(*pfVar8) && !NAN(fVar23))) {
                  uVar16 = 0xffffffffffffffff;
                  lVar11 = 0;
                  while (uVar16 != 4) {
                    lVar15 = uVar16 + 2;
                    uVar16 = uVar16 + 1;
                    lVar19 = lVar11 + 1;
                    if ((pfVar8[lVar15] != p->m_s[lVar19]) ||
                       (lVar11 = lVar11 + 1, NAN(pfVar8[lVar15]) || NAN(p->m_s[lVar19])))
                    goto LAB_0017b6bf;
                  }
                  uVar16 = 5;
LAB_0017b6bf:
                  if (4 < uVar16) {
                    bVar4 = false;
                    break;
                  }
                }
                bVar21 = uVar13 == 0;
                uVar13 = uVar13 - 1;
                if (bVar21) {
                  uVar13 = uVar17;
                }
                uVar16 = (ulong)uVar13;
                pfVar8 = pfVar8 + -8;
                if (bVar21) {
                  pfVar8 = pfVar10;
                }
              } while (uVar13 != uVar7);
            }
          }
LAB_0017b6de:
          if (bVar4) goto LAB_0017b6e6;
        }
        fVar22 = 0.0;
        lVar11 = 0;
        do {
          fVar23 = *(float *)(*(long *)((long)pData_ptr + 0x98) +
                              (ulong)*(uint *)(*(long *)((long)pData_ptr + 0x68) + 0x18 +
                                              (ulong)uVar13 * 0x20) * 0x18 + lVar11 * 4) -
                   p->m_s[lVar11];
          fVar22 = fVar22 + fVar23 * fVar23;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 6);
        uVar16 = 0;
        uVar9 = 0;
        if ((ulong)*(uint *)((long)pData_ptr + 0xa0) != 0) {
          pfVar8 = (float *)(*(long *)((long)pData_ptr + 0x98) + 0x14);
          uVar12 = 0;
          fVar23 = 1e+37;
          do {
            fVar25 = pfVar8[-5] - ptVar1[uVar20].color_endpoint.m_s[0];
            fVar24 = pfVar8[-4] - ptVar1[uVar20].color_endpoint.m_s[1];
            fVar24 = fVar24 * fVar24 + fVar25 * fVar25 + 0.0;
            iVar14 = 7;
            if ((fVar24 <= fVar22) &&
               (fVar26 = pfVar8[-3] - ptVar1[uVar20].color_endpoint.m_s[2],
               fVar25 = pfVar8[-2] - ptVar1[uVar20].color_endpoint.m_s[3],
               fVar24 = fVar25 * fVar25 + fVar26 * fVar26 + fVar24, fVar24 <= fVar22)) {
              fVar26 = pfVar8[-1] - ptVar1[uVar20].color_endpoint.m_s[4];
              fVar25 = *pfVar8 - ptVar1[uVar20].color_endpoint.m_s[5];
              fVar24 = fVar25 * fVar25 + fVar26 * fVar26 + fVar24;
              iVar14 = 0;
              if (fVar24 < fVar23) {
                iVar14 = 0;
                if ((fVar24 == 0.0) && (iVar14 = 0, !NAN(fVar24))) {
                  iVar14 = 5;
                }
                uVar16 = uVar12 & 0xffffffff;
                fVar23 = fVar24;
              }
            }
            uVar9 = (uint16)uVar16;
            if ((iVar14 != 7) && (iVar14 != 0)) break;
            uVar12 = uVar12 + 1;
            pfVar8 = pfVar8 + 6;
          } while (*(uint *)((long)pData_ptr + 0xa0) != uVar12);
        }
        (this->m_tiles).m_p[uVar20].cluster_indices[0] = uVar9;
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 < (uVar18 & 0xffffffff));
  }
  return;
}

Assistant:

void dxt_hc::determine_color_endpoint_clusters_task(uint64 data, void* pData_ptr)
    {
        tree_clusterizer<vec6F>* vq = (tree_clusterizer<vec6F>*)pData_ptr;
        const crnlib::vector<vec6F>& codebook = vq->get_codebook();
        uint num_tasks = m_pTask_pool->get_num_threads() + 1;
        for (uint t = m_tiles.size() * data / num_tasks, tEnd = m_tiles.size() * (data + 1) / num_tasks; t < tEnd; t++)
        {
            if (m_tiles[t].pixels.size())
            {
                const vec6F& v = m_tiles[t].color_endpoint;
                float node_dist = codebook[vq->get_node_index(v)].squared_distance(v);
                float best_dist = math::cNearlyInfinite;
                uint best_index = 0;
                for (uint i = 0; i < codebook.size(); i++)
                {
                    const vec6F& c = codebook[i];
                    float dist = 0;
                    float d0 = c[0] - v[0];
                    dist += d0 * d0;
                    float d1 = c[1] - v[1];
                    dist += d1 * d1;
                    if (dist > node_dist)
                    {
                        continue;
                    }
                    float d2 = c[2] - v[2];
                    dist += d2 * d2;
                    float d3 = c[3] - v[3];
                    dist += d3 * d3;
                    if (dist > node_dist)
                    {
                        continue;
                    }
                    float d4 = c[4] - v[4];
                    dist += d4 * d4;
                    float d5 = c[5] - v[5];
                    dist += d5 * d5;
                    if (dist < best_dist)
                    {
                        best_dist = dist;
                        best_index = i;
                        if (best_dist == 0.0f)
                        {
                            break;
                        }
                    }
                }
                m_tiles[t].cluster_indices[cColor] = best_index;
            }
        }
    }